

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

EmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitMemAccess<false,true>
          (WasmBytecodeGenerator *this,WasmOp wasmOp,WasmType *signature,ViewType viewType)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  RegSlot location_;
  undefined4 *puVar6;
  WasmReaderBase *pWVar7;
  WasmCompilationException *pWVar8;
  WasmRegisterSpace *this_00;
  OpCodeAsmJs op;
  EmitInfo EStack_54;
  RegSlot resultReg;
  EmitInfo exprInfo;
  uint32 offset;
  uint32 alignment;
  uint32 naturalAlignment;
  WasmType type;
  ViewType viewType_local;
  WasmType *signature_local;
  WasmBytecodeGenerator *pWStack_18;
  WasmOp wasmOp_local;
  WasmBytecodeGenerator *this_local;
  
  naturalAlignment._3_1_ = viewType;
  _type = signature;
  signature_local._6_2_ = wasmOp;
  pWStack_18 = this;
  bVar4 = Threads::IsEnabled();
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x66e,"(!isAtomic || Wasm::Threads::IsEnabled())",
                       "!isAtomic || Wasm::Threads::IsEnabled()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  alignment = *_type;
  SetUsesMemory(this,0);
  uVar1 = *(uint *)(Js::ArrayBufferView::NaturalAlignment + (ulong)naturalAlignment._3_1_ * 4);
  pWVar7 = GetReader(this);
  uVar5 = (uint)(pWVar7->m_currentNode).field_1.mem.alignment;
  pWVar7 = GetReader(this);
  uVar2 = (pWVar7->m_currentNode).field_1.brTable.numTargets;
  if (uVar1 < uVar5) {
    pWVar8 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (pWVar8,L"alignment must not be larger than natural");
    __cxa_throw(pWVar8,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  if (uVar5 != uVar1) {
    pWVar8 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (pWVar8,L"invalid alignment for atomic RW. Expected %u, got %u",(ulong)uVar1,
               (ulong)uVar5);
    __cxa_throw(pWVar8,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  EStack_54 = PopEvalStack(this,FirstLocalType,L"Index expression must be of type i32");
  ReleaseLocation(this,&stack0xffffffffffffffac);
  this_00 = GetRegisterSpace(this,alignment);
  location_ = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1c])
            (this->m_writer,0x101,(ulong)location_,(ulong)EStack_54 & 0xffffffff,(ulong)uVar2,
             (ulong)naturalAlignment._3_1_);
  EmitInfo::EmitInfo((EmitInfo *)&this_local,location_,&alignment);
  return (EmitInfo)this_local;
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitMemAccess(WasmOp wasmOp, const WasmTypes::WasmType* signature, Js::ArrayBufferView::ViewType viewType)
{
    Assert(!isAtomic || Wasm::Threads::IsEnabled());
    WasmTypes::WasmType type = signature[0];
    SetUsesMemory(0);

    const uint32 naturalAlignment = Js::ArrayBufferView::NaturalAlignment[viewType];
    const uint32 alignment = GetReader()->m_currentNode.mem.alignment;
    const uint32 offset = GetReader()->m_currentNode.mem.offset;

    if (alignment > naturalAlignment)
    {
        throw WasmCompilationException(_u("alignment must not be larger than natural"));
    }
    if (isAtomic && alignment != naturalAlignment)
    {
        throw WasmCompilationException(_u("invalid alignment for atomic RW. Expected %u, got %u"), naturalAlignment, alignment);
    }

    // Stores
    if (isStore)
    {
        EmitInfo rhsInfo = PopEvalStack(type, _u("Invalid type for store op"));
        EmitInfo exprInfo = PopEvalStack(WasmTypes::I32, _u("Index expression must be of type i32"));
        Js::OpCodeAsmJs op = isAtomic ? Js::OpCodeAsmJs::StArrAtomic : Js::OpCodeAsmJs::StArrWasm;
        m_writer->WasmMemAccess(op, rhsInfo.location, exprInfo.location, offset, viewType);
        ReleaseLocation(&rhsInfo);
        ReleaseLocation(&exprInfo);

        return EmitInfo();
    }

    // Loads
    EmitInfo exprInfo = PopEvalStack(WasmTypes::I32, _u("Index expression must be of type i32"));
    ReleaseLocation(&exprInfo);
    Js::RegSlot resultReg = GetRegisterSpace(type)->AcquireTmpRegister();
    Js::OpCodeAsmJs op = isAtomic ? Js::OpCodeAsmJs::LdArrAtomic : Js::OpCodeAsmJs::LdArrWasm;
    m_writer->WasmMemAccess(op, resultReg, exprInfo.location, offset, viewType);

    return EmitInfo(resultReg, type);
}